

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderProgramResource.cpp
# Opt level: O0

IterateResult __thiscall
glcts::GeometryShaderProgramResourceTest::iterate(GeometryShaderProgramResourceTest *this)

{
  GLuint index;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  RenderContext *pRVar11;
  undefined4 extraout_var;
  TestLog *pTVar13;
  MessageBuilder *pMVar14;
  MessageBuilder local_13d0;
  MessageBuilder local_1250;
  MessageBuilder local_10d0;
  MessageBuilder local_f50;
  MessageBuilder local_dd0;
  MessageBuilder local_c50;
  MessageBuilder local_ad0;
  MessageBuilder local_950;
  MessageBuilder local_7d0;
  MessageBuilder local_650;
  MessageBuilder local_4d0;
  MessageBuilder local_350;
  MessageBuilder local_1c0;
  undefined4 local_40;
  GLuint local_3c;
  GLenum props [1];
  GLint params [1];
  GLuint atom_vertical_uniform_buffer_indx;
  GLuint atom_horizontal_uniform_buffer_indx;
  GLuint atom_vertical_uniform_indx;
  GLuint atom_horizontal_uniform_indx;
  Functions *gl;
  bool local_18;
  bool local_17;
  bool is_vs_in_position_program_input_referenced;
  bool is_vs_in_color_program_input_referenced;
  bool is_uni_model_view_projection_uniform_referenced;
  bool is_uni_matrices_uniform_referenced;
  bool is_uni_colors_white_uniform_referenced;
  bool is_uni_colors_uniform_referenced;
  bool is_uni_atom_vertical_uniform_referenced;
  bool is_uni_atom_horizontal_uniform_referenced;
  bool is_storage_positions_shader_storage_block_referenced;
  bool is_storage_ids_shader_storage_block_referenced;
  bool is_positions_position_buffer_variable_referenced;
  bool is_ids_ids_buffer_variable_referenced;
  bool is_gl_fs_out_color_program_output_referenced;
  bool result;
  GeometryShaderProgramResourceTest *this_local;
  long lVar12;
  
  initTest(this);
  is_uni_matrices_uniform_referenced = false;
  is_uni_model_view_projection_uniform_referenced = false;
  is_vs_in_color_program_input_referenced = false;
  is_vs_in_position_program_input_referenced = false;
  local_17 = false;
  local_18 = false;
  bVar1 = checkIfResourceIsReferenced
                    (this,this->m_program_object_id,0x92e1,"uni_model_view_projection");
  bVar2 = checkIfResourceIsReferenced(this,this->m_program_object_id,0x92e1,"uni_colors_white");
  bVar3 = checkIfResourceIsReferenced(this,this->m_program_object_id,0x92e2,"Matrices");
  bVar4 = checkIfResourceIsReferenced(this,this->m_program_object_id,0x92e2,"Colors");
  if ((this->m_ssbos_supported & 1U) != 0) {
    is_vs_in_position_program_input_referenced =
         checkIfResourceIsReferenced(this,this->m_program_object_id,0x92e6,"Positions");
    is_vs_in_color_program_input_referenced =
         checkIfResourceIsReferenced(this,this->m_program_object_id,0x92e6,"Ids");
    is_uni_model_view_projection_uniform_referenced =
         checkIfResourceIsReferenced(this,this->m_program_object_id,0x92e5,"Positions.position");
    is_uni_matrices_uniform_referenced =
         checkIfResourceIsReferenced(this,this->m_program_object_id,0x92e5,"Ids.ids");
  }
  bVar5 = checkIfResourceIsReferenced(this,this->m_program_object_id,0x92e3,"vs_in_position");
  bVar6 = checkIfResourceIsReferenced(this,this->m_program_object_id,0x92e3,"vs_in_color");
  bVar7 = checkIfResourceIsReferenced(this,this->m_program_object_id,0x92e4,"fs_out_color");
  if ((this->m_atomic_counters_supported & 1U) != 0) {
    pRVar11 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
    iVar8 = (*pRVar11->_vptr_RenderContext[3])();
    lVar12 = CONCAT44(extraout_var,iVar8);
    uVar9 = (**(code **)(lVar12 + 0x9a8))(this->m_program_object_id,0x92e1,"uni_atom_horizontal");
    uVar10 = (**(code **)(lVar12 + 0x9a8))(this->m_program_object_id,0x92e1,"uni_atom_vertical");
    props[0] = 0xffffffff;
    memset(&local_3c,0,4);
    local_40 = 0x9301;
    (**(code **)(lVar12 + 0x9c8))(this->m_program_object_id,0x92e1,uVar9,1,&local_40,1,0,&local_3c);
    index = local_3c;
    (**(code **)(lVar12 + 0x9c8))(this->m_program_object_id,0x92e1,uVar10,1,&local_40,1,0,&local_3c)
    ;
    props[0] = local_3c;
    local_17 = checkIfResourceAtIndexIsReferenced(this,this->m_program_object_id,0x92c0,index);
    local_18 = checkIfResourceAtIndexIsReferenced(this,this->m_program_object_id,0x92c0,props[0]);
  }
  if (!bVar2) {
    pTVar13 = tcu::TestContext::getLog
                        ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1c0,pTVar13,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar14 = tcu::MessageBuilder::operator<<
                        (&local_1c0,
                         (char (*) [76])
                         "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_UNIFORM"
                        );
    tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1c0);
  }
  is_uni_colors_uniform_referenced = bVar2;
  if (!bVar4) {
    pTVar13 = tcu::TestContext::getLog
                        ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_350,pTVar13,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar14 = tcu::MessageBuilder::operator<<
                        (&local_350,
                         (char (*) [82])
                         "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_UNIFORM_BLOCK"
                        );
    tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_350);
    is_uni_colors_uniform_referenced = false;
  }
  if ((local_18 != true) && ((this->m_atomic_counters_supported & 1U) != 0)) {
    pTVar13 = tcu::TestContext::getLog
                        ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_4d0,pTVar13,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar14 = tcu::MessageBuilder::operator<<
                        (&local_4d0,
                         (char (*) [90])
                         "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_ATOMIC_COUNTER_BUFFER"
                        );
    tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4d0);
    is_uni_colors_uniform_referenced = false;
  }
  if ((local_17 != false) && ((this->m_atomic_counters_supported & 1U) != 0)) {
    pTVar13 = tcu::TestContext::getLog
                        ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_650,pTVar13,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar14 = tcu::MessageBuilder::operator<<
                        (&local_650,
                         (char (*) [90])
                         "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_ATOMIC_COUNTER_BUFFER"
                        );
    tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_650);
    is_uni_colors_uniform_referenced = false;
  }
  if ((is_vs_in_position_program_input_referenced != true) && ((this->m_ssbos_supported & 1U) != 0))
  {
    pTVar13 = tcu::TestContext::getLog
                        ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_7d0,pTVar13,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar14 = tcu::MessageBuilder::operator<<
                        (&local_7d0,
                         (char (*) [89])
                         "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_SHADER_STORAGE_BLOCK"
                        );
    tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_7d0);
    is_uni_colors_uniform_referenced = false;
  }
  if ((is_vs_in_color_program_input_referenced != false) && ((this->m_ssbos_supported & 1U) != 0)) {
    pTVar13 = tcu::TestContext::getLog
                        ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_950,pTVar13,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar14 = tcu::MessageBuilder::operator<<
                        (&local_950,
                         (char (*) [89])
                         "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_SHADER_STORAGE_BLOCK"
                        );
    tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_950);
    is_uni_colors_uniform_referenced = false;
  }
  if ((is_uni_model_view_projection_uniform_referenced != true) &&
     ((this->m_ssbos_supported & 1U) != 0)) {
    pTVar13 = tcu::TestContext::getLog
                        ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_ad0,pTVar13,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar14 = tcu::MessageBuilder::operator<<
                        (&local_ad0,
                         (char (*) [84])
                         "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_BUFFER_VARIABLE"
                        );
    tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_ad0);
    is_uni_colors_uniform_referenced = false;
  }
  if ((is_uni_matrices_uniform_referenced != false) && ((this->m_ssbos_supported & 1U) != 0)) {
    pTVar13 = tcu::TestContext::getLog
                        ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_c50,pTVar13,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar14 = tcu::MessageBuilder::operator<<
                        (&local_c50,
                         (char (*) [84])
                         "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_BUFFER_VARIABLE"
                        );
    tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_c50);
    is_uni_colors_uniform_referenced = false;
  }
  if (bVar1) {
    pTVar13 = tcu::TestContext::getLog
                        ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_dd0,pTVar13,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar14 = tcu::MessageBuilder::operator<<
                        (&local_dd0,
                         (char (*) [76])
                         "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_UNIFORM"
                        );
    tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_dd0);
    is_uni_colors_uniform_referenced = false;
  }
  if (bVar3) {
    pTVar13 = tcu::TestContext::getLog
                        ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_f50,pTVar13,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar14 = tcu::MessageBuilder::operator<<
                        (&local_f50,
                         (char (*) [82])
                         "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_UNIFORM_BLOCK"
                        );
    tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_f50);
    is_uni_colors_uniform_referenced = false;
  }
  if (bVar5) {
    pTVar13 = tcu::TestContext::getLog
                        ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_10d0,pTVar13,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar14 = tcu::MessageBuilder::operator<<
                        (&local_10d0,
                         (char (*) [82])
                         "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_PROGRAM_INPUT"
                        );
    tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_10d0);
    is_uni_colors_uniform_referenced = false;
  }
  if (bVar6) {
    pTVar13 = tcu::TestContext::getLog
                        ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1250,pTVar13,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar14 = tcu::MessageBuilder::operator<<
                        (&local_1250,
                         (char (*) [82])
                         "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_PROGRAM_INPUT"
                        );
    tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1250);
    is_uni_colors_uniform_referenced = false;
  }
  if (bVar7) {
    pTVar13 = tcu::TestContext::getLog
                        ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_13d0,pTVar13,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar14 = tcu::MessageBuilder::operator<<
                        (&local_13d0,
                         (char (*) [83])
                         "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_PROGRAM_OUTPUT"
                        );
    tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_13d0);
    is_uni_colors_uniform_referenced = false;
  }
  if (is_uni_colors_uniform_referenced) {
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_PASS,"Pass");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Fail");
  }
  return STOP;
}

Assistant:

tcu::TestCase::IterateResult GeometryShaderProgramResourceTest::iterate()
{
	initTest();

	/* Results */
	bool result = true;

	/* Results of checks, names come from shaders */
	bool is_gl_fs_out_color_program_output_referenced		  = false;
	bool is_ids_ids_buffer_variable_referenced				  = false;
	bool is_positions_position_buffer_variable_referenced	 = false;
	bool is_storage_ids_shader_storage_block_referenced		  = false;
	bool is_storage_positions_shader_storage_block_referenced = false;
	bool is_uni_atom_horizontal_uniform_referenced			  = false;
	bool is_uni_atom_vertical_uniform_referenced			  = false;
	bool is_uni_colors_uniform_referenced					  = false;
	bool is_uni_colors_white_uniform_referenced				  = false;
	bool is_uni_matrices_uniform_referenced					  = false;
	bool is_uni_model_view_projection_uniform_referenced	  = false;
	bool is_vs_in_color_program_input_referenced			  = false;
	bool is_vs_in_position_program_input_referenced			  = false;

	/* Check whether uniform variables are referenced */
	is_uni_model_view_projection_uniform_referenced =
		checkIfResourceIsReferenced(m_program_object_id, GL_UNIFORM, "uni_model_view_projection");
	is_uni_colors_white_uniform_referenced =
		checkIfResourceIsReferenced(m_program_object_id, GL_UNIFORM, "uni_colors_white");

	/* For: uniform Matrices {} uni_matrices; uniform block name is: Matrices */
	is_uni_matrices_uniform_referenced = checkIfResourceIsReferenced(m_program_object_id, GL_UNIFORM_BLOCK, "Matrices");
	is_uni_colors_uniform_referenced   = checkIfResourceIsReferenced(m_program_object_id, GL_UNIFORM_BLOCK, "Colors");

	/* For: buffer Positions {} storage_positions; storage block name is: Positions */
	if (m_ssbos_supported)
	{
		is_storage_positions_shader_storage_block_referenced =
			checkIfResourceIsReferenced(m_program_object_id, GL_SHADER_STORAGE_BLOCK, "Positions");
		is_storage_ids_shader_storage_block_referenced =
			checkIfResourceIsReferenced(m_program_object_id, GL_SHADER_STORAGE_BLOCK, "Ids");

		is_positions_position_buffer_variable_referenced =
			checkIfResourceIsReferenced(m_program_object_id, GL_BUFFER_VARIABLE, "Positions.position");
		is_ids_ids_buffer_variable_referenced =
			checkIfResourceIsReferenced(m_program_object_id, GL_BUFFER_VARIABLE, "Ids.ids");
	}

	/* Check whether input attributes are referenced */
	is_vs_in_position_program_input_referenced =
		checkIfResourceIsReferenced(m_program_object_id, GL_PROGRAM_INPUT, "vs_in_position");
	is_vs_in_color_program_input_referenced =
		checkIfResourceIsReferenced(m_program_object_id, GL_PROGRAM_INPUT, "vs_in_color");

	/* Check whether output attributes are referenced */
	is_gl_fs_out_color_program_output_referenced =
		checkIfResourceIsReferenced(m_program_object_id, GL_PROGRAM_OUTPUT, "fs_out_color");

	/*
	 *     For the ATOMIC_COUNTER_BUFFER interface, the list of active buffer binding
	 *     points is built by identifying each unique binding point associated with
	 *     one or more active atomic counter uniform variables.  Active atomic
	 *     counter buffers do not have an associated name string.
	 */
	if (m_atomic_counters_supported)
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		/* First get corresponding uniform indices */
		glw::GLuint atom_horizontal_uniform_indx =
			gl.getProgramResourceIndex(m_program_object_id, GL_UNIFORM, "uni_atom_horizontal");
		glw::GLuint atom_vertical_uniform_indx =
			gl.getProgramResourceIndex(m_program_object_id, GL_UNIFORM, "uni_atom_vertical");

		/* Then get atomic buffer indices */
		glw::GLuint atom_horizontal_uniform_buffer_indx = GL_INVALID_INDEX;
		glw::GLuint atom_vertical_uniform_buffer_indx   = GL_INVALID_INDEX;

		/* Data for getProgramResourceiv */
		glw::GLint  params[] = { 0 };
		glw::GLenum props[]  = { GL_ATOMIC_COUNTER_BUFFER_INDEX };

		/* Get property value */
		gl.getProgramResourceiv(m_program_object_id, GL_UNIFORM, atom_horizontal_uniform_indx, 1, /* propCount */
								props, 1,														  /* bufSize */
								0,																  /* length */
								params);
		atom_horizontal_uniform_buffer_indx = params[0];

		gl.getProgramResourceiv(m_program_object_id, GL_UNIFORM, atom_vertical_uniform_indx, 1, /* propCount */
								props, 1,														/* bufSize */
								0,																/* length */
								params);
		atom_vertical_uniform_buffer_indx = params[0];

		/* Check whether atomic counters are referenced using the atomic buffer indices */
		is_uni_atom_horizontal_uniform_referenced = checkIfResourceAtIndexIsReferenced(
			m_program_object_id, GL_ATOMIC_COUNTER_BUFFER, atom_horizontal_uniform_buffer_indx);
		is_uni_atom_vertical_uniform_referenced = checkIfResourceAtIndexIsReferenced(
			m_program_object_id, GL_ATOMIC_COUNTER_BUFFER, atom_vertical_uniform_buffer_indx);
	}

	/* Verify results: referenced properties */
	if (true != is_uni_colors_white_uniform_referenced)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_UNIFORM"
						   << tcu::TestLog::EndMessage;

		result = false;
	}

	if (true != is_uni_colors_uniform_referenced)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_UNIFORM_BLOCK"
						   << tcu::TestLog::EndMessage;

		result = false;
	}

	if (true != is_uni_atom_vertical_uniform_referenced && m_atomic_counters_supported)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_ATOMIC_COUNTER_BUFFER"
			<< tcu::TestLog::EndMessage;

		result = false;
	}

	if (false != is_uni_atom_horizontal_uniform_referenced && m_atomic_counters_supported)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_ATOMIC_COUNTER_BUFFER"
			<< tcu::TestLog::EndMessage;

		result = false;
	}

	if (true != is_storage_positions_shader_storage_block_referenced && m_ssbos_supported)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_SHADER_STORAGE_BLOCK"
						   << tcu::TestLog::EndMessage;

		result = false;
	}

	if (false != is_storage_ids_shader_storage_block_referenced && m_ssbos_supported)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_SHADER_STORAGE_BLOCK"
						   << tcu::TestLog::EndMessage;

		result = false;
	}

	if (true != is_positions_position_buffer_variable_referenced && m_ssbos_supported)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_BUFFER_VARIABLE"
						   << tcu::TestLog::EndMessage;

		result = false;
	}

	if (false != is_ids_ids_buffer_variable_referenced && m_ssbos_supported)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_BUFFER_VARIABLE"
						   << tcu::TestLog::EndMessage;

		result = false;
	}

	/* Verify results: properties that are not referenced */
	if (false != is_uni_model_view_projection_uniform_referenced)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_UNIFORM"
						   << tcu::TestLog::EndMessage;

		result = false;
	}

	if (false != is_uni_matrices_uniform_referenced)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_UNIFORM_BLOCK"
						   << tcu::TestLog::EndMessage;

		result = false;
	}

	if (false != is_vs_in_position_program_input_referenced)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_PROGRAM_INPUT"
						   << tcu::TestLog::EndMessage;

		result = false;
	}

	if (false != is_vs_in_color_program_input_referenced)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_PROGRAM_INPUT"
						   << tcu::TestLog::EndMessage;

		result = false;
	}

	if (false != is_gl_fs_out_color_program_output_referenced)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_PROGRAM_OUTPUT"
						   << tcu::TestLog::EndMessage;

		result = false;
	}

	/* Set test result */
	if (true == result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return STOP;
}